

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

undefined8 __thiscall despot::Pocman::NextPos(Pocman *this,Coord *from,int dir)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Coord *coord;
  Coord nextPos;
  undefined8 local_28;
  Coord local_20 [8];
  
  despot::Coord::Coord(&nextPos);
  if (((*(int *)from == 0) && (dir == 3)) && (iVar2 = *(int *)(from + 4), iVar2 == this->passage_y_)
     ) {
    iVar3 = (this->maze_).xsize_ + -1;
LAB_0010adf9:
    despot::Coord::Coord((Coord *)&local_28,iVar3,iVar2);
  }
  else {
    if (((*(int *)from == (this->maze_).xsize_ + -1) && (dir == 1)) &&
       (iVar2 = *(int *)(from + 4), iVar2 == this->passage_y_)) {
      iVar3 = 0;
      goto LAB_0010adf9;
    }
    local_28 = despot::operator+(from,(Coord *)(&Compass::DIRECTIONS + dir));
  }
  coord = &nextPos;
  _nextPos = local_28;
  bVar1 = Grid<int>::Inside(&this->maze_,coord);
  if (bVar1) {
    bVar1 = Passable(this,coord);
    if (bVar1) goto LAB_0010ae3c;
  }
  coord = local_20;
  despot::Coord::Coord(coord,-1,-1);
LAB_0010ae3c:
  return *(undefined8 *)coord;
}

Assistant:

Coord Pocman::NextPos(const Coord& from, int dir) const {
	Coord nextPos;
	if (from.x == 0 && from.y == passage_y_ && dir == Compass::WEST)
		nextPos = Coord(maze_.xsize() - 1, from.y);
	else if (from.x == maze_.xsize() - 1 && from.y == passage_y_
		&& dir == Compass::EAST)
		nextPos = Coord(0, from.y);
	else
		nextPos = from + Compass::DIRECTIONS[dir];

	if (maze_.Inside(nextPos) && Passable(nextPos))
		return nextPos;
	else
		return Coord(-1, -1);
}